

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locavailable.cpp
# Opt level: O3

UBool locale_available_cleanup(void)

{
  UMemory *this;
  void *in_RSI;
  long lVar1;
  long lVar2;
  
  if (icu_63::availableLocaleList != 0) {
    this = (UMemory *)(icu_63::availableLocaleList + -8);
    if (*(long *)(icu_63::availableLocaleList + -8) != 0) {
      lVar1 = icu_63::availableLocaleList + -0xe0;
      lVar2 = *(long *)(icu_63::availableLocaleList + -8) * 0xe0;
      do {
        icu_63::Locale::~Locale((Locale *)(lVar1 + lVar2));
        lVar2 = lVar2 + -0xe0;
      } while (lVar2 != 0);
    }
    icu_63::UMemory::operator_delete__(this,in_RSI);
    icu_63::availableLocaleList = 0;
  }
  icu_63::availableLocaleListCount = 0;
  LOCK();
  icu_63::gInitOnceLocale = 0;
  UNLOCK();
  return '\x01';
}

Assistant:

U_NAMESPACE_USE

    if (availableLocaleList) {
        delete []availableLocaleList;
        availableLocaleList = NULL;
    }